

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.h
# Opt level: O0

char __thiscall data_structures::Stack<char>::pop(Stack<char> *this)

{
  char cVar1;
  bool bVar2;
  out_of_range *this_00;
  ListNode<char> *pLVar3;
  char result;
  Stack<char> *this_local;
  
  bVar2 = isEmpty(this);
  if (!bVar2) {
    pLVar3 = LinkedList<char>::begin(&this->_list);
    cVar1 = pLVar3->element;
    LinkedList<char>::deleteFromHeader(&this->_list);
    return cVar1;
  }
  this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
  std::out_of_range::out_of_range(this_00,"Noting in this stack !");
  __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

inline
    T Stack<T>::pop() {
        if (isEmpty()) {
            throw std::out_of_range("Noting in this stack !");
        }
        T result = _list.begin()->element;
        _list.deleteFromHeader();
        return result;
    }